

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

double * EularToQuaternion(double yaw,double pitch,double roll)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  pdVar1 = (double *)malloc(0x20);
  dVar2 = cos(roll * 0.5);
  dVar3 = sin(roll * 0.5);
  dVar4 = cos(pitch * 0.5);
  dVar5 = sin(pitch * 0.5);
  dVar6 = cos(yaw * 0.5);
  dVar7 = sin(yaw * 0.5);
  *pdVar1 = dVar6 * dVar4 * dVar2 + dVar7 * dVar3 * dVar5;
  pdVar1[1] = dVar6 * dVar4 * dVar3 + dVar7 * -(dVar5 * dVar2);
  pdVar1[2] = dVar6 * dVar5 * dVar2 + dVar7 * dVar4 * dVar3;
  pdVar1[3] = dVar7 * dVar4 * dVar2 + dVar6 * -dVar3 * dVar3;
  return pdVar1;
}

Assistant:

double *EularToQuaternion(double yaw, double pitch, double roll) {
    double *Qresult = (double *) malloc(sizeof(double) * 4);
    double cosRoll = cos(roll * 0.5);
    double sinRoll = sin(roll * 0.5);
    double cosPitch = cos(pitch * 0.5);
    double sinPitch = sin(pitch * 0.5);
    double cosYaw = cos(yaw * 0.5);
    double sinYaw = sin(yaw * 0.5);

    Qresult[0] = (double) (cosRoll * cosPitch * cosYaw + sinRoll * sinPitch * sinYaw);
    Qresult[1] = (double) (sinRoll * cosPitch * cosYaw - cosRoll * sinPitch * sinYaw);
    Qresult[2] = (double) (cosRoll * sinPitch * cosYaw + sinRoll * cosPitch * sinYaw);
    Qresult[3] = (double) (cosRoll * cosPitch * sinYaw - sinRoll * sinRoll * cosYaw);

    return Qresult;
}